

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

int __thiscall ON_BrepTrim::EdgeCurveIndexOf(ON_BrepTrim *this)

{
  int iVar1;
  ON_Brep *pOVar2;
  
  pOVar2 = this->m_brep;
  if (pOVar2 != (ON_Brep *)0x0) {
    iVar1 = this->m_ei;
    if ((((-1 < (long)iVar1) &&
         (iVar1 < (pOVar2->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                  m_count)) &&
        (iVar1 = (pOVar2->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                 m_a[iVar1].m_c3i, -1 < iVar1)) &&
       (iVar1 < (pOVar2->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int ON_BrepTrim::EdgeCurveIndexOf() const
{
  int c3i = -1;
  if ( m_brep && m_ei >= 0 && m_ei < m_brep->m_E.Count() )
  {
    c3i = m_brep->m_E[m_ei].m_c3i;
    if ( c3i < 0 || c3i >= m_brep->m_C3.Count() )
      c3i = -1;
  }
  return c3i;
}